

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void P_TraceBleed(int damage,AActor *target,DAngle *angle,DAngle *pitch)

{
  DAngle local_28;
  DAngle local_20;
  DVector3 local_18;
  
  local_18.X = (target->__Pos).X;
  local_18.Y = (target->__Pos).Y;
  local_18.Z = target->Height * 0.5 + (target->__Pos).Z;
  local_20 = (DAngle)angle->Degrees;
  local_28 = (DAngle)pitch->Degrees;
  P_TraceBleed(damage,&local_18,target,&local_20,&local_28);
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target, DAngle angle, DAngle pitch)
{
	P_TraceBleed(damage, target->PosPlusZ(target->Height/2), target, angle, pitch);
}